

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# excp_helper.c
# Opt level: O2

void helper_tw_ppc64(CPUPPCState_conflict2 *env,target_ulong arg1,target_ulong arg2,uint32_t flags)

{
  uint uVar1;
  uint uVar2;
  uintptr_t unaff_retaddr;
  
  uVar2 = (uint)arg1;
  uVar1 = (uint)arg2;
  if ((((((int)uVar2 < (int)uVar1 & (byte)((flags & 0x10) >> 4)) == 0) &&
       (((int)uVar1 < (int)uVar2 & (byte)((flags & 8) >> 3)) == 0)) &&
      ((uVar2 == uVar1 & (byte)((flags & 4) >> 2)) == 0)) &&
     (((uVar2 < uVar1 & (byte)((flags & 2) >> 1)) == 0 && ((flags & 1) == 0 || uVar2 <= uVar1)))) {
    return;
  }
  raise_exception_err_ra_ppc64(env,6,0x40,unaff_retaddr);
}

Assistant:

void helper_tw(CPUPPCState *env, target_ulong arg1, target_ulong arg2,
               uint32_t flags)
{
    if (!likely(!(((int32_t)arg1 < (int32_t)arg2 && (flags & 0x10)) ||
                  ((int32_t)arg1 > (int32_t)arg2 && (flags & 0x08)) ||
                  ((int32_t)arg1 == (int32_t)arg2 && (flags & 0x04)) ||
                  ((uint32_t)arg1 < (uint32_t)arg2 && (flags & 0x02)) ||
                  ((uint32_t)arg1 > (uint32_t)arg2 && (flags & 0x01))))) {
        raise_exception_err_ra(env, POWERPC_EXCP_PROGRAM,
                               POWERPC_EXCP_TRAP, GETPC());
    }
}